

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdInitializeFundPsbt(void *handle,void **fund_handle)

{
  void *pvVar1;
  undefined8 *puVar2;
  CfdException *this;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  if (fund_handle != (void **)0x0) {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"PsbtFund","");
    pvVar1 = cfd::capi::AllocBuffer((string *)local_50,0x40);
    if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
      operator_delete((void *)local_50._0_8_);
    }
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x10) = puVar2;
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined8 **)((long)pvVar1 + 0x18) = puVar2;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0x4034000000000000;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0x4034000000000000;
    *(undefined8 *)((long)pvVar1 + 0x28) = 0x4008000000000000;
    *(undefined8 *)((long)pvVar1 + 0x38) = 0xffffffffffffffff;
    *fund_handle = pvVar1;
    return 0;
  }
  local_50._0_8_ = "cfdcapi_psbt.cpp";
  local_50._8_4_ = 0x980;
  local_50._16_8_ = "CfdInitializeFundPsbt";
  cfd::core::logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"fund handle is null.")
  ;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. fund handle is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeFundPsbt(void* handle, void** fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtFundHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    if (fund_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "fund handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fund handle is null.");
    }

    buffer = static_cast<CfdCapiPsbtFundHandle*>(
        AllocBuffer(kPrefixPsbtFundHandle, sizeof(CfdCapiPsbtFundHandle)));
    buffer->utxos = new std::vector<UtxoData>();
    buffer->indexes = new std::vector<uint32_t>();
    buffer->fee_rate = 20.0;
    buffer->long_term_fee_rate = 20.0;
    buffer->dust_fee_rate = 3.0;
    buffer->knapsack_min_change = -1;
    *fund_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreeFundPsbt(handle, buffer);
  return result;
}